

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O1

FT_STATUS read_from_device(FT_HANDLE ftHandle,PFT_PROGRAM_DATA ftData)

{
  FT_STATUS FVar1;
  
  ftData->Signature1 = 0;
  ftData->Signature2 = 0xffffffff;
  ftData->Version = 5;
  ftData->Manufacturer = ManufacturerBuf;
  ftData->ManufacturerId = ManufacturerIdBuf;
  ftData->Description = DescriptionBuf;
  ftData->SerialNumber = SerialNumberBuf;
  FVar1 = FT_EE_Read();
  return FVar1;
}

Assistant:

FT_STATUS read_from_device(FT_HANDLE ftHandle, PFT_PROGRAM_DATA ftData) {
    ftData->Signature1 = 0x00000000;
    ftData->Signature2 = 0xffffffff;
    ftData->Version = 0x00000005;
    ftData->Manufacturer = ManufacturerBuf;
    ftData->ManufacturerId = ManufacturerIdBuf;
    ftData->Description = DescriptionBuf;
    ftData->SerialNumber = SerialNumberBuf;

    return FT_EE_Read(ftHandle, ftData);
}